

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenko.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenko::GetStateBlock
          (ChElementBeamTaperedTimoshenko *this,ChVectorDynamic<> *mD)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double delta_rot_angle;
  ChQuaternion<double> *local_148;
  ChQuaternion<double> *local_140;
  undefined1 local_138 [48];
  undefined1 local_108 [16];
  double local_f8;
  undefined1 local_e8 [64];
  ChQuaternion<double> q_delta1;
  ChVector<double> delta_rot_dir;
  ChQuaternion<double> local_70;
  ChQuaternion<double> q_delta0;
  
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,0xc);
  local_140 = &this->q_element_abs_rot;
  delta_rot_dir.m_data[0] = 0.0;
  delta_rot_dir.m_data[1] = 0.0;
  delta_rot_dir.m_data[2] = 0.0;
  ChQuaternion<double>::RotateBack
            (local_140,
             (ChVector<double> *)
             ((long)&((((this->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->super_ChNodeFEAbase + 0x20));
  local_148 = &this->q_element_ref_rot;
  ChQuaternion<double>::RotateBack
            (local_148,
             (ChVector<double> *)
             ((long)&((((this->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->X0 + 8));
  auVar1._8_4_ = local_138._8_4_;
  auVar1._0_8_ = local_138._0_8_;
  auVar1._12_4_ = local_138._12_4_;
  local_108 = vsubpd_avx(local_e8._0_16_,auVar1);
  local_f8 = (double)local_e8._16_8_ - (double)CONCAT44(local_138._20_4_,local_138._16_4_);
  local_138._0_8_ = local_108;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_e8,mD,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)local_e8,
             (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_138);
  local_138._0_8_ = (this->q_element_abs_rot).m_data[0];
  auVar3._0_8_ = -(this->q_element_abs_rot).m_data[3];
  auVar3._8_4_ = 0;
  auVar3._12_4_ = 0x80000000;
  local_138._8_4_ = *(undefined4 *)((this->q_element_abs_rot).m_data + 1);
  local_138._16_4_ = *(undefined4 *)((this->q_element_abs_rot).m_data + 2);
  local_138._12_4_ = *(uint *)((long)(this->q_element_abs_rot).m_data + 0xc) ^ 0x80000000;
  local_138._20_4_ = *(uint *)((long)(this->q_element_abs_rot).m_data + 0x14) ^ 0x80000000;
  local_138._24_8_ = vmovlps_avx(auVar3);
  ChQuaternion<double>::operator%
            ((ChQuaternion<double> *)local_e8,(ChQuaternion<double> *)local_138,
             (ChQuaternion<double> *)
             &((((this->nodes).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
              ->field_0x38);
  q_delta1.m_data[0] = (this->q_refrotA).m_data[0];
  auVar4._0_8_ = -(this->q_refrotA).m_data[3];
  auVar4._8_4_ = 0;
  auVar4._12_4_ = 0x80000000;
  q_delta1.m_data[1]._0_4_ = *(undefined4 *)((this->q_refrotA).m_data + 1);
  q_delta1.m_data[2]._0_4_ = *(undefined4 *)((this->q_refrotA).m_data + 2);
  q_delta1.m_data[1]._4_4_ = *(uint *)((long)(this->q_refrotA).m_data + 0xc) ^ 0x80000000;
  q_delta1.m_data[2]._4_4_ = *(uint *)((long)(this->q_refrotA).m_data + 0x14) ^ 0x80000000;
  q_delta1.m_data[3] = (double)vmovlps_avx(auVar4);
  ChQuaternion<double>::operator%(&q_delta0,(ChQuaternion<double> *)local_e8,&q_delta1);
  ChQuaternion<double>::Q_to_AngAxis(&q_delta0,&delta_rot_angle,&delta_rot_dir);
  if (3.141592653589793 < delta_rot_angle) {
    delta_rot_angle = delta_rot_angle + -6.283185307179586;
  }
  q_delta1.m_data[0] = (double)&delta_rot_dir;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                    *)local_138,&delta_rot_angle,(StorageBaseType *)&q_delta1);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_e8,mD,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const>>
            ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)local_e8,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)local_138);
  ChQuaternion<double>::RotateBack
            (local_140,
             (ChVector<double> *)
             ((long)&((this->nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].
                      super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->super_ChNodeFEAbase + 0x20));
  ChQuaternion<double>::RotateBack
            (local_148,
             (ChVector<double> *)
             ((long)&((this->nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].
                      super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->X0 + 8));
  auVar2._8_4_ = local_138._8_4_;
  auVar2._0_8_ = local_138._0_8_;
  auVar2._12_4_ = local_138._12_4_;
  local_108 = vsubpd_avx(local_e8._0_16_,auVar2);
  local_f8 = (double)local_e8._16_8_ - (double)CONCAT44(local_138._20_4_,local_138._16_4_);
  local_138._0_8_ = local_108;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_e8,mD,6,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)local_e8,
             (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_138);
  local_138._0_8_ = (this->q_element_abs_rot).m_data[0];
  auVar5._0_8_ = -(this->q_element_abs_rot).m_data[3];
  auVar5._8_4_ = 0;
  auVar5._12_4_ = 0x80000000;
  local_138._8_4_ = *(undefined4 *)((this->q_element_abs_rot).m_data + 1);
  local_138._16_4_ = *(undefined4 *)((this->q_element_abs_rot).m_data + 2);
  local_138._12_4_ = *(uint *)((long)(this->q_element_abs_rot).m_data + 0xc) ^ 0x80000000;
  local_138._20_4_ = *(uint *)((long)(this->q_element_abs_rot).m_data + 0x14) ^ 0x80000000;
  local_138._24_8_ = vmovlps_avx(auVar5);
  ChQuaternion<double>::operator%
            ((ChQuaternion<double> *)local_e8,(ChQuaternion<double> *)local_138,
             (ChQuaternion<double> *)
             &((this->nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].
               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->field_0x38);
  local_70.m_data[0] = (this->q_refrotB).m_data[0];
  auVar6._0_8_ = -(this->q_refrotB).m_data[3];
  auVar6._8_4_ = 0;
  auVar6._12_4_ = 0x80000000;
  local_70.m_data[1]._0_4_ = *(undefined4 *)((this->q_refrotB).m_data + 1);
  local_70.m_data[2]._0_4_ = *(undefined4 *)((this->q_refrotB).m_data + 2);
  local_70.m_data[1]._4_4_ = *(uint *)((long)(this->q_refrotB).m_data + 0xc) ^ 0x80000000;
  local_70.m_data[2]._4_4_ = *(uint *)((long)(this->q_refrotB).m_data + 0x14) ^ 0x80000000;
  local_70.m_data[3] = (double)vmovlps_avx(auVar6);
  ChQuaternion<double>::operator%(&q_delta1,(ChQuaternion<double> *)local_e8,&local_70);
  ChQuaternion<double>::Q_to_AngAxis(&q_delta1,&delta_rot_angle,&delta_rot_dir);
  if (3.141592653589793 < delta_rot_angle) {
    delta_rot_angle = delta_rot_angle + -6.283185307179586;
  }
  local_70.m_data[0] = (double)&delta_rot_dir;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                    *)local_138,&delta_rot_angle,(StorageBaseType *)&local_70);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_e8,mD,9,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const>>
            ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)local_e8,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)local_138);
  return;
}

Assistant:

void ChElementBeamTaperedTimoshenko::GetStateBlock(ChVectorDynamic<>& mD) {
    mD.resize(12);

    ChVector<> delta_rot_dir;
    double delta_rot_angle;

    // Node 0, displacement (in local element frame, corotated back)
    //     d = [Atw]' Xt - [A0w]'X0
    ChVector<> displ = this->q_element_abs_rot.RotateBack(nodes[0]->Frame().GetPos()) -
                       this->q_element_ref_rot.RotateBack(nodes[0]->GetX0().GetPos());
    mD.segment(0, 3) = displ.eigen();

    // Node 0, x,y,z small rotations (in local element frame)
    ChQuaternion<> q_delta0 = q_element_abs_rot.GetConjugate() % nodes[0]->Frame().GetRot() % q_refrotA.GetConjugate();
    // note, for small incremental rotations this is opposite of ChNodeFEAxyzrot::VariablesQbIncrementPosition
    q_delta0.Q_to_AngAxis(delta_rot_angle, delta_rot_dir);

    if (delta_rot_angle > CH_C_PI)
        delta_rot_angle -= CH_C_2PI;  // no 0..360 range, use -180..+180

    mD.segment(3, 3) = delta_rot_angle * delta_rot_dir.eigen();

    // Node 1, displacement (in local element frame, corotated back)
    //     d = [Atw]' Xt - [A0w]'X0
    displ = this->q_element_abs_rot.RotateBack(nodes[1]->Frame().GetPos()) -
            this->q_element_ref_rot.RotateBack(nodes[1]->GetX0().GetPos());
    mD.segment(6, 3) = displ.eigen();

    // Node 1, x,y,z small rotations (in local element frame)
    ChQuaternion<> q_delta1 = q_element_abs_rot.GetConjugate() % nodes[1]->Frame().GetRot() % q_refrotB.GetConjugate();
    // note, for small incremental rotations this is opposite of ChNodeFEAxyzrot::VariablesQbIncrementPosition
    q_delta1.Q_to_AngAxis(delta_rot_angle, delta_rot_dir);

    if (delta_rot_angle > CH_C_PI)
        delta_rot_angle -= CH_C_2PI;  // no 0..360 range, use -180..+180

    mD.segment(9, 3) = delta_rot_angle * delta_rot_dir.eigen();
}